

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCPackGenerator.cxx
# Opt level: O3

int __thiscall cmCPackGenerator::PrepareNames(cmCPackGenerator *this)

{
  cmCPackLog *pcVar1;
  pointer pcVar2;
  undefined8 uVar3;
  bool bVar4;
  int iVar5;
  size_t sVar6;
  ostream *poVar7;
  string *psVar8;
  cmValue cVar9;
  undefined4 extraout_var;
  long *plVar10;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  cmValue cVar11;
  long *plVar12;
  char cVar13;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views;
  string_view algo;
  ostringstream cmCPackLog_msg;
  string outName;
  string tempDirectory;
  string outFile;
  string destFile;
  string topDirectory;
  ostringstream ostr;
  string line;
  ostringstream cmCPackLog_msg_10;
  undefined1 local_608 [16];
  undefined1 local_5f8 [16];
  byte abStack_5e8 [80];
  ios_base local_598 [408];
  long *local_400 [2];
  long local_3f0 [2];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3e0;
  string local_3c0;
  long *local_3a0;
  long local_398;
  long local_390;
  long lStack_388;
  long *local_380 [2];
  long local_370 [2];
  long *local_360;
  long local_358;
  long local_350 [2];
  undefined1 local_340 [112];
  ios_base local_2d0 [264];
  string local_1c8;
  undefined1 local_1a8 [16];
  string local_198 [3];
  ios_base local_138 [264];
  
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_608);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_608,"Create temp directory.",0x16);
  std::ios::widen((char)local_608 + (char)*(_func_int **)(local_608._0_8_ + -0x18));
  cVar13 = (char)local_608;
  std::ostream::put(cVar13);
  std::ostream::flush();
  pcVar1 = this->Logger;
  std::__cxx11::stringbuf::str();
  uVar3 = local_340._0_8_;
  sVar6 = strlen((char *)local_340._0_8_);
  cmCPackLog::Log(pcVar1,4,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/CPack/cmCPackGenerator.cxx"
                  ,0x3c,(char *)uVar3,sVar6);
  if ((undefined1 *)local_340._0_8_ != local_340 + 0x10) {
    operator_delete((void *)local_340._0_8_,local_340._16_8_ + 1);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_608);
  std::ios_base::~ios_base(local_598);
  local_608._0_8_ = local_5f8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_608,"CPACK_SET_DESTDIR","");
  bVar4 = IsOn(this,(string *)local_608);
  if ((undefined1 *)local_608._0_8_ != local_5f8) {
    operator_delete((void *)local_608._0_8_,local_5f8._0_8_ + 1);
  }
  if (bVar4) {
    iVar5 = (*this->_vptr_cmCPackGenerator[0x16])(this);
    if (iVar5 == 3) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_608);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_608,"CPACK_SET_DESTDIR is set to ON but the \'",0x28);
      poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)local_608,(this->Name)._M_dataplus._M_p,
                          (this->Name)._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar7,"\' generator does NOT support it.",0x20);
      std::ios::widen((char)poVar7->_vptr_basic_ostream[-3] + (char)poVar7);
      std::ostream::put((char)poVar7);
      std::ostream::flush();
      pcVar1 = this->Logger;
      std::__cxx11::stringbuf::str();
      uVar3 = local_340._0_8_;
      sVar6 = strlen((char *)local_340._0_8_);
      cmCPackLog::Log(pcVar1,0x10,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/CPack/cmCPackGenerator.cxx"
                      ,0x44,(char *)uVar3,sVar6);
      if ((undefined1 *)local_340._0_8_ != local_340 + 0x10) {
        operator_delete((void *)local_340._0_8_,local_340._16_8_ + 1);
      }
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_608);
      std::ios_base::~ios_base(local_598);
      return 0;
    }
    iVar5 = (*this->_vptr_cmCPackGenerator[0x16])(this);
    if (iVar5 == 2) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_608);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_608,"CPACK_SET_DESTDIR is set to ON but it is ",0x29);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_608,"usually a bad idea to do that with \'",0x24);
      poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)local_608,(this->Name)._M_dataplus._M_p,
                          (this->Name)._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar7,"\' generator. Use at your own risk.",0x22);
      std::ios::widen((char)poVar7->_vptr_basic_ostream[-3] + (char)poVar7);
      std::ostream::put((char)poVar7);
      std::ostream::flush();
      pcVar1 = this->Logger;
      std::__cxx11::stringbuf::str();
      uVar3 = local_340._0_8_;
      sVar6 = strlen((char *)local_340._0_8_);
      cmCPackLog::Log(pcVar1,8,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/CPack/cmCPackGenerator.cxx"
                      ,0x4b,(char *)uVar3,sVar6);
      if ((undefined1 *)local_340._0_8_ != local_340 + 0x10) {
        operator_delete((void *)local_340._0_8_,local_340._16_8_ + 1);
      }
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_608);
      std::ios_base::~ios_base(local_598);
    }
  }
  local_340._0_8_ = local_340 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_340,"CPACK_PACKAGE_DIRECTORY","");
  psVar8 = (string *)GetOption(this,(string *)local_340);
  if (psVar8 == (string *)0x0) {
    psVar8 = &cmValue::Empty_abi_cxx11_;
  }
  local_608._8_8_ = (psVar8->_M_dataplus)._M_p;
  local_608._0_8_ = psVar8->_M_string_length;
  local_5f8._0_8_ = 0x11;
  local_5f8._8_8_ = "/_CPack_Packages/";
  views._M_len = 2;
  views._M_array = (iterator)local_608;
  cmCatViews_abi_cxx11_(&local_3c0,views);
  if ((undefined1 *)local_340._0_8_ != local_340 + 0x10) {
    operator_delete((void *)local_340._0_8_,local_340._16_8_ + 1);
  }
  local_608._0_8_ = local_5f8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_608,"CPACK_TOPLEVEL_TAG","");
  cVar9 = GetOption(this,(string *)local_608);
  if ((undefined1 *)local_608._0_8_ != local_5f8) {
    operator_delete((void *)local_608._0_8_,local_5f8._0_8_ + 1);
  }
  if (cVar9.Value != (string *)0x0) {
    std::__cxx11::string::_M_append((char *)&local_3c0,(ulong)((cVar9.Value)->_M_dataplus)._M_p);
    std::__cxx11::string::append((char *)&local_3c0);
  }
  local_608._0_8_ = local_5f8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_608,"CPACK_GENERATOR","");
  psVar8 = (string *)GetOption(this,(string *)local_608);
  if (psVar8 == (string *)0x0) {
    psVar8 = &cmValue::Empty_abi_cxx11_;
  }
  std::__cxx11::string::_M_append((char *)&local_3c0,(ulong)(psVar8->_M_dataplus)._M_p);
  if ((undefined1 *)local_608._0_8_ != local_5f8) {
    operator_delete((void *)local_608._0_8_,local_5f8._0_8_ + 1);
  }
  local_360 = local_350;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_360,local_3c0._M_dataplus._M_p,
             local_3c0._M_dataplus._M_p + local_3c0._M_string_length);
  local_608._0_8_ = local_5f8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_608,"CPACK_PACKAGE_FILE_NAME","");
  cVar9 = GetOption(this,(string *)local_608);
  if ((undefined1 *)local_608._0_8_ != local_5f8) {
    operator_delete((void *)local_608._0_8_,local_5f8._0_8_ + 1);
  }
  if (cVar9.Value == (string *)0x0) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_608);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_608,"CPACK_PACKAGE_FILE_NAME not specified",0x25);
    std::ios::widen((char)local_608 + (char)*(_func_int **)(local_608._0_8_ + -0x18));
    std::ostream::put(cVar13);
    std::ostream::flush();
    pcVar1 = this->Logger;
    std::__cxx11::stringbuf::str();
    uVar3 = local_340._0_8_;
    sVar6 = strlen((char *)local_340._0_8_);
    cmCPackLog::Log(pcVar1,0x10,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/CPack/cmCPackGenerator.cxx"
                    ,0x5b,(char *)uVar3,sVar6);
    if ((undefined1 *)local_340._0_8_ != local_340 + 0x10) {
      operator_delete((void *)local_340._0_8_,local_340._16_8_ + 1);
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_608);
    std::ios_base::~ios_base(local_598);
    iVar5 = 0;
    goto LAB_00160aeb;
  }
  local_3e0._M_dataplus._M_p = (pointer)&local_3e0.field_2;
  pcVar2 = ((cVar9.Value)->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_3e0,pcVar2,pcVar2 + (cVar9.Value)->_M_string_length);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_608,"/",
                 &local_3e0);
  std::__cxx11::string::_M_append((char *)&local_3c0,local_608._0_8_);
  if ((undefined1 *)local_608._0_8_ != local_5f8) {
    operator_delete((void *)local_608._0_8_,local_5f8._0_8_ + 1);
  }
  iVar5 = (*this->_vptr_cmCPackGenerator[4])(this);
  if (CONCAT44(extraout_var,iVar5) == 0) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_608);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_608,"No output extension specified",0x1d);
    std::ios::widen((char)local_608 + (char)*(_func_int **)(local_608._0_8_ + -0x18));
    std::ostream::put(cVar13);
    std::ostream::flush();
    pcVar1 = this->Logger;
    std::__cxx11::stringbuf::str();
    uVar3 = local_340._0_8_;
    sVar6 = strlen((char *)local_340._0_8_);
    cmCPackLog::Log(pcVar1,0x10,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/CPack/cmCPackGenerator.cxx"
                    ,0x62,(char *)uVar3,sVar6);
LAB_0016013e:
    if ((undefined1 *)local_340._0_8_ != local_340 + 0x10) {
      operator_delete((void *)local_340._0_8_,local_340._16_8_ + 1);
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_608);
    std::ios_base::~ios_base(local_598);
    iVar5 = 0;
  }
  else {
    (*this->_vptr_cmCPackGenerator[4])(this);
    std::__cxx11::string::append((char *)&local_3e0);
    local_608._0_8_ = local_5f8;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_608,"CPACK_PACKAGE_DIRECTORY","");
    cVar9 = GetOption(this,(string *)local_608);
    if ((undefined1 *)local_608._0_8_ != local_5f8) {
      operator_delete((void *)local_608._0_8_,local_5f8._0_8_ + 1);
    }
    if (cVar9.Value == (string *)0x0) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_608);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_608,"CPACK_PACKAGE_DIRECTORY not specified",0x25);
      std::ios::widen((char)local_608 + (char)*(_func_int **)(local_608._0_8_ + -0x18));
      std::ostream::put(cVar13);
      std::ostream::flush();
      pcVar1 = this->Logger;
      std::__cxx11::stringbuf::str();
      uVar3 = local_340._0_8_;
      sVar6 = strlen((char *)local_340._0_8_);
      cmCPackLog::Log(pcVar1,0x10,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/CPack/cmCPackGenerator.cxx"
                      ,0x69,(char *)uVar3,sVar6);
      goto LAB_0016013e;
    }
    local_380[0] = local_370;
    pcVar2 = ((cVar9.Value)->_M_dataplus)._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_380,pcVar2,pcVar2 + (cVar9.Value)->_M_string_length);
    local_608._0_8_ = local_5f8;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_608,"CPACK_OUTPUT_FILE_PREFIX","");
    StoreOptionIfNotSet<cmValue>(this,(string *)local_608,(string *)local_380);
    if ((undefined1 *)local_608._0_8_ != local_5f8) {
      operator_delete((void *)local_608._0_8_,local_5f8._0_8_ + 1);
    }
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_608,
                   "/",&local_3e0);
    std::__cxx11::string::_M_append((char *)local_380,local_608._0_8_);
    if ((undefined1 *)local_608._0_8_ != local_5f8) {
      operator_delete((void *)local_608._0_8_,local_5f8._0_8_ + 1);
    }
    local_608._0_8_ = local_5f8;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_608,local_360,local_358 + (long)local_360);
    std::__cxx11::string::append(local_608);
    plVar10 = (long *)std::__cxx11::string::_M_append(local_608,(ulong)local_3e0._M_dataplus._M_p);
    local_3a0 = &local_390;
    plVar12 = plVar10 + 2;
    if ((long *)*plVar10 == plVar12) {
      local_390 = *plVar12;
      lStack_388 = plVar10[3];
    }
    else {
      local_390 = *plVar12;
      local_3a0 = (long *)*plVar10;
    }
    local_398 = plVar10[1];
    *plVar10 = (long)plVar12;
    plVar10[1] = 0;
    *(undefined1 *)(plVar10 + 2) = 0;
    if ((undefined1 *)local_608._0_8_ != local_5f8) {
      operator_delete((void *)local_608._0_8_,local_5f8._0_8_ + 1);
    }
    local_608._0_8_ = local_5f8;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_608,"CPACK_TOPLEVEL_DIRECTORY","");
    StoreOptionIfNotSet<cmValue>(this,(string *)local_608,(string *)&local_360);
    if ((undefined1 *)local_608._0_8_ != local_5f8) {
      operator_delete((void *)local_608._0_8_,local_5f8._0_8_ + 1);
    }
    local_608._0_8_ = local_5f8;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_608,"CPACK_TEMPORARY_DIRECTORY","");
    StoreOptionIfNotSet<cmValue>(this,(string *)local_608,&local_3c0);
    if ((undefined1 *)local_608._0_8_ != local_5f8) {
      operator_delete((void *)local_608._0_8_,local_5f8._0_8_ + 1);
    }
    local_608._0_8_ = local_5f8;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_608,"CPACK_OUTPUT_FILE_NAME","")
    ;
    StoreOptionIfNotSet<cmValue>(this,(string *)local_608,&local_3e0);
    if ((undefined1 *)local_608._0_8_ != local_5f8) {
      operator_delete((void *)local_608._0_8_,local_5f8._0_8_ + 1);
    }
    local_608._0_8_ = local_5f8;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_608,"CPACK_OUTPUT_FILE_PATH","")
    ;
    StoreOptionIfNotSet<cmValue>(this,(string *)local_608,(string *)local_380);
    if ((undefined1 *)local_608._0_8_ != local_5f8) {
      operator_delete((void *)local_608._0_8_,local_5f8._0_8_ + 1);
    }
    local_608._0_8_ = local_5f8;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_608,"CPACK_TEMPORARY_PACKAGE_FILE_NAME","");
    StoreOptionIfNotSet<cmValue>(this,(string *)local_608,(string *)&local_3a0);
    if ((undefined1 *)local_608._0_8_ != local_5f8) {
      operator_delete((void *)local_608._0_8_,local_5f8._0_8_ + 1);
    }
    local_608._0_8_ = local_5f8;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_608,"CPACK_INSTALL_DIRECTORY","");
    iVar5 = (*this->_vptr_cmCPackGenerator[10])(this);
    StoreOptionIfNotSet<char_const*>
              (this,(string *)local_608,(char *)CONCAT44(extraout_var_00,iVar5));
    if ((undefined1 *)local_608._0_8_ != local_5f8) {
      operator_delete((void *)local_608._0_8_,local_5f8._0_8_ + 1);
    }
    local_608._0_8_ = local_5f8;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_608,"CPACK_NATIVE_INSTALL_DIRECTORY","");
    iVar5 = (*this->_vptr_cmCPackGenerator[10])(this);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_1a8,(char *)CONCAT44(extraout_var_01,iVar5),
               (allocator<char> *)&local_1c8);
    cmsys::SystemTools::ConvertToOutputPath((string *)local_340,(string *)local_1a8);
    StoreOptionIfNotSet<cmValue>(this,(string *)local_608,(string *)local_340);
    if ((undefined1 *)local_340._0_8_ != local_340 + 0x10) {
      operator_delete((void *)local_340._0_8_,local_340._16_8_ + 1);
    }
    if ((string *)local_1a8._0_8_ != local_198) {
      operator_delete((void *)local_1a8._0_8_,(long)local_198[0]._M_dataplus._M_p + 1);
    }
    if ((undefined1 *)local_608._0_8_ != local_5f8) {
      operator_delete((void *)local_608._0_8_,local_5f8._0_8_ + 1);
    }
    local_608._0_8_ = local_5f8;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_608,"CPACK_TEMPORARY_INSTALL_DIRECTORY","");
    StoreOptionIfNotSet<cmValue>(this,(string *)local_608,&local_3c0);
    if ((undefined1 *)local_608._0_8_ != local_5f8) {
      operator_delete((void *)local_608._0_8_,local_5f8._0_8_ + 1);
    }
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_608);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_608,"Look for: CPACK_PACKAGE_DESCRIPTION_FILE",0x28);
    std::ios::widen((char)local_608 + (char)*(_func_int **)(local_608._0_8_ + -0x18));
    std::ostream::put(cVar13);
    std::ostream::flush();
    pcVar1 = this->Logger;
    std::__cxx11::stringbuf::str();
    uVar3 = local_340._0_8_;
    sVar6 = strlen((char *)local_340._0_8_);
    cmCPackLog::Log(pcVar1,4,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/CPack/cmCPackGenerator.cxx"
                    ,0x7d,(char *)uVar3,sVar6);
    if ((undefined1 *)local_340._0_8_ != local_340 + 0x10) {
      operator_delete((void *)local_340._0_8_,local_340._16_8_ + 1);
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_608);
    std::ios_base::~ios_base(local_598);
    local_608._0_8_ = local_5f8;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_608,"CPACK_PACKAGE_DESCRIPTION_FILE","");
    cVar9 = GetOption(this,(string *)local_608);
    if ((undefined1 *)local_608._0_8_ != local_5f8) {
      operator_delete((void *)local_608._0_8_,local_5f8._0_8_ + 1);
    }
    if (cVar9.Value == (string *)0x0) {
LAB_001605a3:
      local_608._0_8_ = local_5f8;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_608,"CPACK_PACKAGE_DESCRIPTION","");
      cVar9 = GetOption(this,(string *)local_608);
      if ((undefined1 *)local_608._0_8_ != local_5f8) {
        operator_delete((void *)local_608._0_8_,local_5f8._0_8_ + 1);
      }
      if (cVar9.Value == (string *)0x0) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_608);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_608,
                   "Project description not specified. Please specify CPACK_PACKAGE_DESCRIPTION or CPACK_PACKAGE_DESCRIPTION_FILE."
                   ,0x6e);
        std::ios::widen((char)local_608 + (char)*(_func_int **)(local_608._0_8_ + -0x18));
        std::ostream::put(cVar13);
        std::ostream::flush();
        pcVar1 = this->Logger;
        std::__cxx11::stringbuf::str();
        uVar3 = local_340._0_8_;
        sVar6 = strlen((char *)local_340._0_8_);
        cmCPackLog::Log(pcVar1,0x10,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/CPack/cmCPackGenerator.cxx"
                        ,0xa3,(char *)uVar3,sVar6);
LAB_00160a3c:
        if ((undefined1 *)local_340._0_8_ != local_340 + 0x10) {
          operator_delete((void *)local_340._0_8_,local_340._16_8_ + 1);
        }
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_608);
        std::ios_base::~ios_base(local_598);
        goto LAB_00160a7a;
      }
      local_608._0_8_ = local_5f8;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_608,"CPACK_PACKAGE_CHECKSUM","");
      cVar9 = GetOption(this,(string *)local_608);
      if ((undefined1 *)local_608._0_8_ != local_5f8) {
        operator_delete((void *)local_608._0_8_,local_5f8._0_8_ + 1);
      }
      if (cVar9.Value != (string *)0x0) {
        algo._M_str = (char *)(cVar9.Value)->_M_string_length;
        algo._M_len = (size_t)local_608;
        cmCryptoHash::New(algo);
        uVar3 = local_608._0_8_;
        std::unique_ptr<cmCryptoHash,_std::default_delete<cmCryptoHash>_>::~unique_ptr
                  ((unique_ptr<cmCryptoHash,_std::default_delete<cmCryptoHash>_> *)local_608);
        if ((_func_int **)uVar3 == (_func_int **)0x0) {
          std::__cxx11::ostringstream::ostringstream((ostringstream *)local_608);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_608,"Cannot recognize algorithm: ",0x1c);
          poVar7 = operator<<((ostream *)local_608,cVar9);
          std::endl<char,std::char_traits<char>>(poVar7);
          pcVar1 = this->Logger;
          std::__cxx11::stringbuf::str();
          uVar3 = local_340._0_8_;
          sVar6 = strlen((char *)local_340._0_8_);
          cmCPackLog::Log(pcVar1,0x10,
                          "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/CPack/cmCPackGenerator.cxx"
                          ,0xab,(char *)uVar3,sVar6);
          goto LAB_00160a3c;
        }
      }
      local_608._0_8_ = local_5f8;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_608,"CPACK_REMOVE_TOPLEVEL_DIRECTORY","");
      StoreOptionIfNotSet<char_const*>(this,(string *)local_608,"1");
      if ((undefined1 *)local_608._0_8_ != local_5f8) {
        operator_delete((void *)local_608._0_8_,local_5f8._0_8_ + 1);
      }
      iVar5 = 1;
    }
    else {
      local_608._0_8_ = local_5f8;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_608,"CPACK_PACKAGE_DESCRIPTION","");
      cVar11 = GetOption(this,(string *)local_608);
      if ((undefined1 *)local_608._0_8_ != local_5f8) {
        operator_delete((void *)local_608._0_8_,local_5f8._0_8_ + 1);
      }
      if (cVar11.Value != (string *)0x0) goto LAB_001605a3;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_608);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_608,"Look for: ",10);
      poVar7 = operator<<((ostream *)local_608,cVar9);
      std::ios::widen((char)poVar7->_vptr_basic_ostream[-3] + (char)poVar7);
      std::ostream::put((char)poVar7);
      std::ostream::flush();
      pcVar1 = this->Logger;
      std::__cxx11::stringbuf::str();
      uVar3 = local_340._0_8_;
      sVar6 = strlen((char *)local_340._0_8_);
      cmCPackLog::Log(pcVar1,4,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/CPack/cmCPackGenerator.cxx"
                      ,0x81,(char *)uVar3,sVar6);
      if ((undefined1 *)local_340._0_8_ != local_340 + 0x10) {
        operator_delete((void *)local_340._0_8_,local_340._16_8_ + 1);
      }
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_608);
      std::ios_base::~ios_base(local_598);
      bVar4 = cmsys::SystemTools::FileExists(cVar9.Value);
      if (!bVar4) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_608);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_608,"Cannot find description file name: [",0x24);
        poVar7 = operator<<((ostream *)local_608,cVar9);
        std::__ostream_insert<char,std::char_traits<char>>(poVar7,"]",1);
        std::ios::widen((char)poVar7->_vptr_basic_ostream[-3] + (char)poVar7);
        std::ostream::put((char)poVar7);
        std::ostream::flush();
        pcVar1 = this->Logger;
        std::__cxx11::stringbuf::str();
        uVar3 = local_340._0_8_;
        sVar6 = strlen((char *)local_340._0_8_);
        cmCPackLog::Log(pcVar1,0x10,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/CPack/cmCPackGenerator.cxx"
                        ,0x85,(char *)uVar3,sVar6);
        goto LAB_00160a3c;
      }
      std::ifstream::ifstream(local_608,((cVar9.Value)->_M_dataplus)._M_p,_S_in);
      if ((abStack_5e8[(long)*(_func_int **)(local_608._0_8_ + -0x18)] & 5) == 0) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_340);
        local_1c8._M_dataplus._M_p = (pointer)&local_1c8.field_2;
        local_1c8._M_string_length = 0;
        local_1c8.field_2._M_local_buf[0] = '\0';
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_1a8,"Read description file: ",0x17);
        poVar7 = operator<<((ostream *)local_1a8,cVar9);
        std::endl<char,std::char_traits<char>>(poVar7);
        pcVar1 = this->Logger;
        std::__cxx11::stringbuf::str();
        plVar10 = local_400[0];
        sVar6 = strlen((char *)local_400[0]);
        cmCPackLog::Log(pcVar1,2,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/CPack/cmCPackGenerator.cxx"
                        ,0x93,(char *)plVar10,sVar6);
        if (local_400[0] != local_3f0) {
          operator_delete(local_400[0],local_3f0[0] + 1);
        }
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
        std::ios_base::~ios_base(local_138);
        if ((abStack_5e8[(long)*(_func_int **)(local_608._0_8_ + -0x18)] & 5) == 0) {
          do {
            bVar4 = cmsys::SystemTools::GetLineFromStream
                              ((istream *)local_608,&local_1c8,(bool *)0x0,0xffffffffffffffff);
            if (!bVar4) break;
            cmXMLSafe::cmXMLSafe((cmXMLSafe *)local_1a8,&local_1c8);
            poVar7 = operator<<((ostream *)local_340,(cmXMLSafe *)local_1a8);
            std::ios::widen((char)poVar7->_vptr_basic_ostream[-3] + (char)poVar7);
            std::ostream::put((char)poVar7);
            std::ostream::flush();
          } while ((abStack_5e8[(long)*(_func_int **)(local_608._0_8_ + -0x18)] & 5) == 0);
        }
        local_1a8._0_8_ = local_198;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_1a8,"CPACK_PACKAGE_DESCRIPTION","");
        std::__cxx11::stringbuf::str();
        StoreOption<cmValue>(this,(string *)local_1a8,(string *)local_400);
        if (local_400[0] != local_3f0) {
          operator_delete(local_400[0],local_3f0[0] + 1);
        }
        if ((string *)local_1a8._0_8_ != local_198) {
          operator_delete((void *)local_1a8._0_8_,(long)local_198[0]._M_dataplus._M_p + 1);
        }
        local_1a8._0_8_ = local_198;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_1a8,"CPACK_DEFAULT_PACKAGE_DESCRIPTION_FILE","");
        cVar11 = GetOption(this,(string *)local_1a8);
        if ((string *)local_1a8._0_8_ != local_198) {
          operator_delete((void *)local_1a8._0_8_,(long)local_198[0]._M_dataplus._M_p + 1);
        }
        if ((cVar11.Value != (string *)0x0) &&
           (local_1a8._0_8_ = cVar11, iVar5 = cmValue::Compare((cmValue *)local_1a8,cVar9),
           iVar5 == 0)) {
          local_1a8._0_8_ = local_198;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_1a8,"CPACK_USED_DEFAULT_PACKAGE_DESCRIPTION_FILE","");
          StoreOption<char_const*>(this,(string *)local_1a8,"ON");
          if ((string *)local_1a8._0_8_ != local_198) {
            operator_delete((void *)local_1a8._0_8_,(long)local_198[0]._M_dataplus._M_p + 1);
          }
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1c8._M_dataplus._M_p != &local_1c8.field_2) {
          operator_delete(local_1c8._M_dataplus._M_p,
                          CONCAT71(local_1c8.field_2._M_allocated_capacity._1_7_,
                                   local_1c8.field_2._M_local_buf[0]) + 1);
        }
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_340);
        std::ios_base::~ios_base(local_2d0);
        std::ifstream::~ifstream(local_608);
        goto LAB_001605a3;
      }
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_340);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_340,"Cannot open description file name: ",0x23);
      poVar7 = operator<<((ostream *)local_340,cVar9);
      std::endl<char,std::char_traits<char>>(poVar7);
      pcVar1 = this->Logger;
      std::__cxx11::stringbuf::str();
      uVar3 = local_1a8._0_8_;
      sVar6 = strlen((char *)local_1a8._0_8_);
      cmCPackLog::Log(pcVar1,0x10,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/CPack/cmCPackGenerator.cxx"
                      ,0x8c,(char *)uVar3,sVar6);
      if ((string *)local_1a8._0_8_ != local_198) {
        operator_delete((void *)local_1a8._0_8_,(long)local_198[0]._M_dataplus._M_p + 1);
      }
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_340);
      std::ios_base::~ios_base(local_2d0);
      std::ifstream::~ifstream(local_608);
LAB_00160a7a:
      iVar5 = 0;
    }
    if (local_3a0 != &local_390) {
      operator_delete(local_3a0,local_390 + 1);
    }
    if (local_380[0] != local_370) {
      operator_delete(local_380[0],local_370[0] + 1);
    }
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3e0._M_dataplus._M_p != &local_3e0.field_2) {
    operator_delete(local_3e0._M_dataplus._M_p,local_3e0.field_2._M_allocated_capacity + 1);
  }
LAB_00160aeb:
  if (local_360 != local_350) {
    operator_delete(local_360,local_350[0] + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3c0._M_dataplus._M_p != &local_3c0.field_2) {
    operator_delete(local_3c0._M_dataplus._M_p,local_3c0.field_2._M_allocated_capacity + 1);
  }
  return iVar5;
}

Assistant:

int cmCPackGenerator::PrepareNames()
{
  cmCPackLogger(cmCPackLog::LOG_DEBUG, "Create temp directory." << std::endl);

  // checks CPACK_SET_DESTDIR support
  if (this->IsOn("CPACK_SET_DESTDIR")) {
    if (SETDESTDIR_UNSUPPORTED == this->SupportsSetDestdir()) {
      cmCPackLogger(cmCPackLog::LOG_ERROR,
                    "CPACK_SET_DESTDIR is set to ON but the '"
                      << this->Name << "' generator does NOT support it."
                      << std::endl);
      return 0;
    }
    if (SETDESTDIR_SHOULD_NOT_BE_USED == this->SupportsSetDestdir()) {
      cmCPackLogger(cmCPackLog::LOG_WARNING,
                    "CPACK_SET_DESTDIR is set to ON but it is "
                      << "usually a bad idea to do that with '" << this->Name
                      << "' generator. Use at your own risk." << std::endl);
    }
  }

  std::string tempDirectory =
    cmStrCat(this->GetOption("CPACK_PACKAGE_DIRECTORY"), "/_CPack_Packages/");
  cmValue toplevelTag = this->GetOption("CPACK_TOPLEVEL_TAG");
  if (toplevelTag) {
    tempDirectory += *toplevelTag;
    tempDirectory += "/";
  }
  tempDirectory += *this->GetOption("CPACK_GENERATOR");
  std::string topDirectory = tempDirectory;
  cmValue pfname = this->GetOption("CPACK_PACKAGE_FILE_NAME");
  if (!pfname) {
    cmCPackLogger(cmCPackLog::LOG_ERROR,
                  "CPACK_PACKAGE_FILE_NAME not specified" << std::endl);
    return 0;
  }
  std::string outName = pfname;
  tempDirectory += "/" + outName;
  if (!this->GetOutputExtension()) {
    cmCPackLogger(cmCPackLog::LOG_ERROR,
                  "No output extension specified" << std::endl);
    return 0;
  }
  outName += this->GetOutputExtension();
  cmValue pdir = this->GetOption("CPACK_PACKAGE_DIRECTORY");
  if (!pdir) {
    cmCPackLogger(cmCPackLog::LOG_ERROR,
                  "CPACK_PACKAGE_DIRECTORY not specified" << std::endl);
    return 0;
  }

  std::string destFile = pdir;
  this->SetOptionIfNotSet("CPACK_OUTPUT_FILE_PREFIX", destFile);
  destFile += "/" + outName;
  std::string outFile = topDirectory + "/" + outName;
  this->SetOptionIfNotSet("CPACK_TOPLEVEL_DIRECTORY", topDirectory);
  this->SetOptionIfNotSet("CPACK_TEMPORARY_DIRECTORY", tempDirectory);
  this->SetOptionIfNotSet("CPACK_OUTPUT_FILE_NAME", outName);
  this->SetOptionIfNotSet("CPACK_OUTPUT_FILE_PATH", destFile);
  this->SetOptionIfNotSet("CPACK_TEMPORARY_PACKAGE_FILE_NAME", outFile);
  this->SetOptionIfNotSet("CPACK_INSTALL_DIRECTORY", this->GetInstallPath());
  this->SetOptionIfNotSet(
    "CPACK_NATIVE_INSTALL_DIRECTORY",
    cmsys::SystemTools::ConvertToOutputPath(this->GetInstallPath()));
  this->SetOptionIfNotSet("CPACK_TEMPORARY_INSTALL_DIRECTORY", tempDirectory);

  cmCPackLogger(cmCPackLog::LOG_DEBUG,
                "Look for: CPACK_PACKAGE_DESCRIPTION_FILE" << std::endl);
  cmValue descFileName = this->GetOption("CPACK_PACKAGE_DESCRIPTION_FILE");
  if (descFileName && !this->GetOption("CPACK_PACKAGE_DESCRIPTION")) {
    cmCPackLogger(cmCPackLog::LOG_DEBUG,
                  "Look for: " << descFileName << std::endl);
    if (!cmSystemTools::FileExists(descFileName)) {
      cmCPackLogger(cmCPackLog::LOG_ERROR,
                    "Cannot find description file name: ["
                      << descFileName << "]" << std::endl);
      return 0;
    }
    cmsys::ifstream ifs(descFileName->c_str());
    if (!ifs) {
      cmCPackLogger(cmCPackLog::LOG_ERROR,
                    "Cannot open description file name: " << descFileName
                                                          << std::endl);
      return 0;
    }
    std::ostringstream ostr;
    std::string line;

    cmCPackLogger(cmCPackLog::LOG_VERBOSE,
                  "Read description file: " << descFileName << std::endl);
    while (ifs && cmSystemTools::GetLineFromStream(ifs, line)) {
      ostr << cmXMLSafe(line) << std::endl;
    }
    this->SetOption("CPACK_PACKAGE_DESCRIPTION", ostr.str());
    cmValue defFileName =
      this->GetOption("CPACK_DEFAULT_PACKAGE_DESCRIPTION_FILE");
    if (defFileName && (defFileName == descFileName)) {
      this->SetOption("CPACK_USED_DEFAULT_PACKAGE_DESCRIPTION_FILE", "ON");
    }
  }
  if (!this->GetOption("CPACK_PACKAGE_DESCRIPTION")) {
    cmCPackLogger(
      cmCPackLog::LOG_ERROR,
      "Project description not specified. Please specify "
      "CPACK_PACKAGE_DESCRIPTION or CPACK_PACKAGE_DESCRIPTION_FILE."
        << std::endl);
    return 0;
  }
  cmValue algoSignature = this->GetOption("CPACK_PACKAGE_CHECKSUM");
  if (algoSignature) {
    if (!cmCryptoHash::New(*algoSignature)) {
      cmCPackLogger(cmCPackLog::LOG_ERROR,
                    "Cannot recognize algorithm: " << algoSignature
                                                   << std::endl);
      return 0;
    }
  }

  this->SetOptionIfNotSet("CPACK_REMOVE_TOPLEVEL_DIRECTORY", "1");

  return 1;
}